

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall wabt::interp::Thread::DoSimdSwizzle(Thread *this)

{
  u8 i;
  long lVar1;
  undefined1 uVar2;
  S result;
  Simd<unsigned_char,_(unsigned_char)__x10_> lhs;
  Simd<unsigned_char,_(unsigned_char)__x10_> rhs;
  Value local_38;
  Value local_28;
  Value local_18;
  
  local_18 = Pop(this);
  local_28 = Pop(this);
  lVar1 = 0;
  do {
    if ((ulong)*(byte *)((long)&local_18 + lVar1) < 0x10) {
      uVar2 = *(undefined1 *)((long)&local_28 + (ulong)*(byte *)((long)&local_18 + lVar1));
    }
    else {
      uVar2 = 0;
    }
    *(undefined1 *)((long)&local_38 + lVar1) = uVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  Push(this,local_38);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdSwizzle() {
  using S = u8x16;
  auto rhs = Pop<S>();
  auto lhs = Pop<S>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result.v[i] = rhs.v[i] < S::lanes ? lhs.v[rhs.v[i]] : 0;
  }
  Push(result);
  return RunResult::Ok;
}